

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O0

void __thiscall rst::Parser::EnterBlock(Parser *this,BlockType *prev_type,BlockType type)

{
  int in_EDX;
  int *in_RSI;
  undefined8 *in_RDI;
  
  if (in_EDX != *in_RSI) {
    if (*in_RSI == 4) {
      (**(code **)(*(long *)*in_RDI + 0x18))();
    }
    if (in_EDX == 4) {
      (**(code **)(*(long *)*in_RDI + 0x10))((long *)*in_RDI,3);
    }
    *in_RSI = in_EDX;
  }
  return;
}

Assistant:

void rst::Parser::EnterBlock(rst::BlockType &prev_type, rst::BlockType type) {
  if (type == prev_type)
    return;
  if (prev_type == LIST_ITEM)
    handler_->EndBlock();
  if (type == LIST_ITEM)
    handler_->StartBlock(BULLET_LIST);
  prev_type = type;
}